

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

bool __thiscall QMakeProject::test(QMakeProject *this,ProKey *func,QList<ProStringList> *args)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Span *pSVar4;
  bool bVar5;
  VisitReturn VVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  const_iterator cVar8;
  const_iterator cVar9;
  QStringView local_90;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<ProString> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QMakeEvaluator).m_current.pro = (ProFile *)0x0;
  (this->super_QMakeEvaluator).m_current.line = 0;
  cVar8 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFindImpl<ProKey>
                    ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)(QMakeInternal::statics + 0x248),
                     func);
  if (cVar8.i.d == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0 &&
      cVar8.i.bucket == 0) {
    cVar9 = QHash<ProKey,_ProFunctionDef>::constFindImpl<ProKey>
                      (&(this->super_QMakeEvaluator).m_functionDefs.testFunctions,func);
    if (cVar9.i.d != (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0 || cVar9.i.bucket != 0
       ) {
      pSVar4 = (cVar9.i.d)->spans;
      uVar7 = cVar9.i.bucket >> 7;
      VVar6 = QMakeEvaluator::evaluateBoolFunction
                        (&this->super_QMakeEvaluator,
                         (ProFunctionDef *)
                         (pSVar4[uVar7].entries[pSVar4[uVar7].offsets[(uint)cVar9.i.bucket & 0x7f]].
                          storage.data + 0x30),args,&func->super_ProString);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar5 = boolRet(VVar6);
        return bVar5;
      }
      goto LAB_00210f0c;
    }
    local_80.d = (Data *)0x0;
    local_80.ptr = (char16_t *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = L"\'%1\' is not a recognized test function.";
    local_80.size = 0;
    local_68.size = 0x27;
    local_50.ptr = (ProString *)(func->super_ProString).m_string.d.ptr;
    local_50.d = (Data *)(func->super_ProString).m_string.d.size;
    local_90 = QStringView::mid((QStringView *)&local_50,(long)(func->super_ProString).m_offset,
                                (long)(func->super_ProString).m_length);
    bVar5 = false;
    QString::arg<QStringView,_true>
              ((QString *)&local_50,(QString *)&local_68,&local_90,0,(QChar)0x20);
    QMakeEvaluator::evalError(&this->super_QMakeEvaluator,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  }
  else {
    pSVar2 = (cVar8.i.d)->spans;
    uVar7 = cVar8.i.bucket >> 7;
    pEVar3 = pSVar2[uVar7].entries;
    bVar1 = pSVar2[uVar7].offsets[(uint)cVar8.i.bucket & 0x7f];
    prepareBuiltinArgs((ProStringList *)&local_50,args);
    VVar6 = QMakeEvaluator::evaluateBuiltinConditional
                      (&this->super_QMakeEvaluator,
                       (QMakeBuiltin *)(pEVar3[bVar1].storage.data + 0x30),func,
                       (ProStringList *)&local_50);
    bVar5 = boolRet(VVar6);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_00210f0c:
  __stack_chk_fail();
}

Assistant:

bool QMakeProject::test(const ProKey &func, const QList<ProStringList> &args)
{
    m_current.clear();

    auto adef = statics.functions.constFind(func);
    if (adef != statics.functions.constEnd())
        return boolRet(evaluateBuiltinConditional(*adef, func, prepareBuiltinArgs(args)));

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.testFunctions.constFind(func);
    if (it != m_functionDefs.testFunctions.constEnd())
        return boolRet(evaluateBoolFunction(*it, args, func));

    evalError(QStringLiteral("'%1' is not a recognized test function.")
              .arg(func.toQStringView()));
    return false;
}